

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::set_deleted_key(dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *this,key_type *key)

{
  type in_RSI;
  sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4> *in_RDI;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000090;
  
  squash_deleted(in_stack_00000090);
  sparsehash_internal::
  sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::set_use_deleted
            (in_RDI,true);
  std::pair<int,_int>::operator=((pair<int,_int> *)&in_RDI[1].field_0xc,in_RSI);
  return;
}

Assistant:

void set_deleted_key(const key_type& key) {
    // the empty indicator (if specified) and the deleted indicator
    // must be different
    assert(
        (!settings.use_empty() || !equals(key, key_info.empty_key)) &&
        "Passed the empty-key to set_deleted_key");
    // It's only safe to change what "deleted" means if we purge deleted guys
    squash_deleted();
    settings.set_use_deleted(true);
    key_info.delkey = key;
  }